

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NonLocalBCImpl.H
# Opt level: O0

int __thiscall amrex::NonLocalBC::PolarFn2::j_index(PolarFn2 *this,int j)

{
  int j_local;
  PolarFn2 *this_local;
  int local_4;
  
  if (j < 0) {
    local_4 = j + this->Ly / 2;
  }
  else if (j < this->Ly) {
    if (j < this->Ly / 2) {
      local_4 = j - this->Ly / 2;
    }
    else {
      local_4 = j + this->Ly / 2;
    }
  }
  else {
    local_4 = j - this->Ly / 2;
  }
  return local_4;
}

Assistant:

AMREX_GPU_HOST_DEVICE
    int j_index (int j) const noexcept {
        if (j < 0) {
            return j+Ly/2;
        } else if (j >= Ly) {
            return j-Ly/2;
        } else if (j < Ly/2) {
            return j-Ly/2;
        } else {
            return j+Ly/2;
        }
    }